

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

MIPMap * pbrt::MIPMap::CreateFromFile
                   (string *filename,MIPMapFilterOptions *options,WrapMode wrapMode,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  float fVar1;
  bool bVar2;
  Tuple2<pbrt::Point2,_int> TVar3;
  MIPMap *pMVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  int x;
  long lVar8;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  allocator<char> local_2eb;
  allocator<char> local_2ea;
  allocator<char> local_2e9;
  Allocator alloc_local;
  WrapMode wrapMode_local;
  MIPMapFilterOptions *local_2d8;
  WrapMode2D local_2d0;
  RGBColorSpace *colorSpace;
  float *local_2c0;
  float local_2ac;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [56];
  ImageChannelDesc rgbDesc;
  ImageChannelDesc rgbaDesc;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_1d0;
  ImageAndMetadata imageAndMetadata;
  
  local_1d0.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  alloc_local = alloc;
  wrapMode_local = wrapMode;
  Image::Read(&imageAndMetadata,filename,alloc,(ColorEncodingHandle *)&local_1d0);
  if ((int)imageAndMetadata.image.channelNames.nStored != 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorSpace,"R",(allocator<char> *)&rgbDesc);
    std::__cxx11::string::string<std::allocator<char>>(local_2a8,"G",&local_2e9);
    std::__cxx11::string::string<std::allocator<char>>(local_288,"B",&local_2ea);
    std::__cxx11::string::string<std::allocator<char>>(local_268,"A",&local_2eb);
    requestedChannels.n = 4;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorSpace;
    Image::GetChannelDesc(&rgbaDesc,&imageAndMetadata.image,requestedChannels);
    lVar6 = 0x60;
    do {
      std::__cxx11::string::~string((string *)((long)&colorSpace + lVar6));
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    std::__cxx11::string::string<std::allocator<char>>((string *)&colorSpace,"R",&local_2e9);
    std::__cxx11::string::string<std::allocator<char>>(local_2a8,"G",&local_2ea);
    std::__cxx11::string::string<std::allocator<char>>(local_288,"B",&local_2eb);
    requestedChannels_00.n = 3;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&colorSpace;
    Image::GetChannelDesc(&rgbDesc,&imageAndMetadata.image,requestedChannels_00);
    lVar6 = 0x40;
    do {
      std::__cxx11::string::~string((string *)((long)&colorSpace + lVar6));
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != -0x20);
    if (rgbaDesc.offset.nStored == 0) {
      if (rgbDesc.offset.nStored == 0) {
        ErrorExit<std::__cxx11::string_const&>
                  ("%s: image doesn\'t have R, G, and B channels",filename);
      }
      Image::SelectChannels((Image *)&colorSpace,&imageAndMetadata.image,&rgbDesc,alloc_local);
      Image::operator=(&imageAndMetadata.image,(Image *)&colorSpace);
    }
    else {
      bVar2 = true;
      lVar7 = 0;
      TVar3 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>;
      local_2d8 = options;
      for (lVar6 = 0; lVar6 < (long)TVar3 >> 0x20; lVar6 = lVar6 + 1) {
        for (lVar8 = 0; lVar8 < TVar3.x; lVar8 = lVar8 + 1) {
          WrapMode2D::WrapMode2D(&local_2d0,Clamp);
          Image::GetChannels((ImageChannelValues *)&colorSpace,&imageAndMetadata.image,
                             (Point2i)(lVar7 + lVar8),&rgbaDesc,local_2d0);
          pfVar5 = local_2c0 + 3;
          if (local_2c0 == (float *)0x0) {
            pfVar5 = &local_2ac;
          }
          fVar1 = *pfVar5;
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                     &colorSpace);
          bVar2 = (bool)(bVar2 & fVar1 == 1.0);
          TVar3 = imageAndMetadata.image.resolution.super_Tuple2<pbrt::Point2,_int>;
        }
        lVar7 = lVar7 + 0x100000000;
      }
      if (bVar2) {
        Image::SelectChannels((Image *)&colorSpace,&imageAndMetadata.image,&rgbDesc,alloc_local);
        options = local_2d8;
        Image::operator=(&imageAndMetadata.image,(Image *)&colorSpace);
      }
      else {
        Image::SelectChannels((Image *)&colorSpace,&imageAndMetadata.image,&rgbaDesc,alloc_local);
        options = local_2d8;
        Image::operator=(&imageAndMetadata.image,(Image *)&colorSpace);
      }
    }
    Image::~Image((Image *)&colorSpace);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&rgbDesc.offset);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&rgbaDesc.offset);
  }
  colorSpace = ImageMetadata::GetColorSpace(&imageAndMetadata.metadata);
  pMVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MIPMap,pbrt::Image,pbrt::RGBColorSpace_const*&,pbrt::WrapMode&,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::MIPMapFilterOptions_const&>
                     (&alloc_local,&imageAndMetadata.image,&colorSpace,&wrapMode_local,&alloc_local,
                      options);
  ImageAndMetadata::~ImageAndMetadata(&imageAndMetadata);
  return pMVar4;
}

Assistant:

MIPMap *MIPMap::CreateFromFile(const std::string &filename,
                               const MIPMapFilterOptions &options, WrapMode wrapMode,
                               ColorEncodingHandle encoding, Allocator alloc) {
    ImageAndMetadata imageAndMetadata = Image::Read(filename, alloc, encoding);

    Image &image = imageAndMetadata.image;
    if (image.NChannels() != 1) {
        // Get the channels in a canonical order..
        ImageChannelDesc rgbaDesc = image.GetChannelDesc({"R", "G", "B", "A"});
        ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
        if (rgbaDesc) {
            // Is alpha all ones?
            bool allOne = true;
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    if (image.GetChannels({x, y}, rgbaDesc)[3] != 1)
                        allOne = false;
            if (allOne)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                image = image.SelectChannels(rgbaDesc, alloc);
        } else {
            if (rgbDesc)
                image = image.SelectChannels(rgbDesc, alloc);
            else
                ErrorExit("%s: image doesn't have R, G, and B channels", filename);
        }
    }

    const RGBColorSpace *colorSpace = imageAndMetadata.metadata.GetColorSpace();
    return alloc.new_object<MIPMap>(std::move(image), colorSpace, wrapMode, alloc,
                                    options);
}